

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm.cpp
# Opt level: O2

int __thiscall ncnn::GroupNorm::forward_inplace(GroupNorm *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int i_1;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 in_XMM7 [16];
  undefined1 auVar26 [16];
  float fVar27;
  
  uVar15 = bottom_top_blob->h * bottom_top_blob->w;
  uVar1 = this->group;
  uVar17 = (long)this->channels / (long)(int)uVar1;
  pvVar3 = bottom_top_blob->data;
  uVar4 = bottom_top_blob->elemsize;
  sVar5 = bottom_top_blob->cstep;
  uVar20 = (long)bottom_top_blob->d * uVar4 * (long)bottom_top_blob->h * (long)bottom_top_blob->w +
           0xf & 0xfffffffffffffff0;
  iVar8 = (int)uVar17;
  uVar11 = 0;
  uVar16 = (ulong)uVar15;
  if ((int)uVar15 < 1) {
    uVar16 = uVar11;
  }
  uVar19 = 0;
  if (0 < iVar8) {
    uVar19 = uVar17 & 0xffffffff;
  }
  uVar17 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar17 = uVar11;
  }
  fVar22 = 1.0 / (float)(int)(iVar8 * uVar15);
  for (; uVar11 != uVar17; uVar11 = uVar11 + 1) {
    lVar18 = sVar5 * uVar4 * uVar11 * (long)iVar8;
    lVar9 = uVar20 - uVar20 % uVar4;
    fVar23 = 0.0;
    for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
      lVar12 = 0;
      uVar14 = uVar16;
      while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
        fVar23 = fVar23 + *(float *)((long)pvVar3 + lVar12 * 4 + lVar9 * uVar10 + lVar18);
        lVar12 = lVar12 + 1;
      }
    }
    fVar23 = fVar23 * fVar22;
    fVar24 = 0.0;
    for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
      lVar12 = 0;
      uVar14 = uVar16;
      while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
        fVar25 = *(float *)((long)pvVar3 + lVar12 * 4 + lVar9 * uVar10 + lVar18) - fVar23;
        fVar24 = fVar24 + fVar25 * fVar25;
        lVar12 = lVar12 + 1;
      }
    }
    fVar24 = fVar24 * fVar22;
    iVar2 = this->affine;
    pvVar6 = (this->gamma_data).data;
    pvVar7 = (this->beta_data).data;
    for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
      if (iVar2 == 0) {
        fVar27 = this->eps + fVar24;
        auVar26 = rsqrtss(in_XMM7,ZEXT416((uint)fVar27));
        fVar25 = auVar26._0_4_;
        in_XMM7._4_12_ = auVar26._4_12_;
        in_XMM7._0_4_ = fVar25 * -0.5 * (fVar27 * fVar25 * fVar25 + -3.0);
        fVar25 = in_XMM7._0_4_ * -fVar23;
      }
      else {
        lVar12 = uVar10 + uVar11 * (long)iVar8;
        fVar27 = this->eps + fVar24;
        auVar26 = rsqrtss(in_XMM7,ZEXT416((uint)fVar27));
        fVar25 = auVar26._0_4_;
        in_XMM7._4_12_ = auVar26._4_12_;
        in_XMM7._0_4_ =
             fVar25 * -0.5 * (fVar27 * fVar25 * fVar25 + -3.0) *
             *(float *)((long)pvVar6 + lVar12 * 4);
        fVar25 = *(float *)((long)pvVar7 + lVar12 * 4) - in_XMM7._0_4_ * fVar23;
      }
      lVar12 = lVar9 * uVar10 + lVar18;
      lVar13 = 0;
      uVar14 = uVar16;
      while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
        *(float *)((long)pvVar3 + lVar13 * 4 + lVar12) =
             *(float *)((long)pvVar3 + lVar13 * 4 + lVar12) * in_XMM7._0_4_ + fVar25;
        lVar13 = lVar13 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int GroupNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    int channels_per_group = channels / group;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);

        // mean and var
        float sum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                sum += ptr[i];
            }
        }
        float mean = sum / (channels_per_group * size);

        float sqsum = 0.f;
        for (int q = 0; q < channels_per_group; q++)
        {
            const float* ptr = bottom_top_blob_g.channel(q);
            for (int i = 0; i < size; i++)
            {
                float tmp = ptr[i] - mean;
                sqsum += tmp * tmp;
            }
        }
        float var = sqsum / (channels_per_group * size);

        for (int q = 0; q < channels_per_group; q++)
        {
            float a;
            float b;
            if (affine)
            {
                float gamma = gamma_data[g * channels_per_group + q];
                float beta = beta_data[g * channels_per_group + q];

                a = static_cast<float>(gamma / sqrt(var + eps));
                b = -mean * a + beta;
            }
            else
            {
                a = static_cast<float>(1.f / (sqrt(var + eps)));
                b = -mean * a;
            }

            float* ptr = bottom_top_blob_g.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    return 0;
}